

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEditPrivate::repaintContents(QTextEditPrivate *this,QRectF *contentsRect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QScrollBar *this_00;
  QWidgetData *pQVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 local_70 [8];
  Representation local_68;
  Representation local_64;
  double local_50;
  double local_48;
  double local_40;
  double dStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((contentsRect->w <= 0.0) || (contentsRect->h <= 0.0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
      return;
    }
  }
  else {
    LVar6 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    this_00 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar6 == RightToLeft) {
      iVar7 = QAbstractSlider::maximum(&this_00->super_QAbstractSlider);
      iVar8 = QAbstractSlider::value
                        (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
      iVar7 = iVar7 - iVar8;
    }
    else {
      iVar7 = QAbstractSlider::value(&this_00->super_QAbstractSlider);
    }
    iVar8 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    local_50 = (double)iVar7;
    local_48 = (double)iVar8;
    pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    uVar1 = (pQVar5->crect).x2;
    uVar3 = (pQVar5->crect).y2;
    uVar2 = (pQVar5->crect).x1;
    uVar4 = (pQVar5->crect).y1;
    local_40 = (double)((uVar1 - uVar2) + 1);
    dStack_38 = (double)((uVar3 - uVar4) + 1);
    QRectF::operator&((QRectF *)local_70,contentsRect);
    auVar9 = QRectF::toAlignedRect();
    if (auVar9._4_4_ <= auVar9._12_4_ && auVar9._0_4_ <= auVar9._8_4_) {
      local_70._0_4_ = auVar9._0_4_ - iVar7;
      local_70._4_4_ = auVar9._4_4_ - iVar8;
      local_68.m_i = auVar9._8_4_ - iVar7;
      local_64.m_i = auVar9._12_4_ - iVar8;
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport,(QRect *)local_70);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::repaintContents(const QRectF &contentsRect)
{
    if (!contentsRect.isValid()) {
        viewport->update();
        return;
    }
    const int xOffset = horizontalOffset();
    const int yOffset = verticalOffset();
    const QRectF visibleRect(xOffset, yOffset, viewport->width(), viewport->height());

    QRect r = contentsRect.intersected(visibleRect).toAlignedRect();
    if (r.isEmpty())
        return;

    r.translate(-xOffset, -yOffset);
    viewport->update(r);
}